

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::update
          (Phase<std::complex<float>_> *this,real_type theta)

{
  int iVar1;
  real_type theta_local;
  Phase<std::complex<float>_> *this_local;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[1])();
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!fixed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/Phase.hpp"
                  ,0xb8,
                  "void qclab::qgates::Phase<std::complex<float>>::update(const real_type) [T = std::complex<float>]"
                 );
  }
  QAngle<float>::update(&this->angle_,theta);
  return;
}

Assistant:

void update( const real_type theta ) {
          assert( !fixed() ) ;
          angle_.update( theta ) ;
        }